

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenu.cpp
# Opt level: O0

void __thiscall
FOptionMenuItem::drawLabel(FOptionMenuItem *this,int indent,int y,EColorRange color,bool grayed)

{
  undefined4 uVar1;
  int iVar2;
  int local_30;
  int w;
  int x;
  int overlay;
  char *label;
  bool grayed_local;
  EColorRange color_local;
  int y_local;
  int indent_local;
  FOptionMenuItem *this_local;
  
  _x = FString::GetChars(&this->mLabel);
  if (*_x == '$') {
    _x = FStringTable::operator()(&GStrings,_x + 1);
  }
  uVar1 = 0;
  if (grayed) {
    uVar1 = 0x60300000;
  }
  local_30 = FFont::StringWidth(SmallFont,_x);
  local_30 = local_30 * CleanXfac_1;
  if ((this->mCentered & 1U) == 0) {
    local_30 = indent - local_30;
  }
  else {
    iVar2 = DCanvas::GetWidth((DCanvas *)screen);
    local_30 = (iVar2 - local_30) / 2;
  }
  DCanvas::DrawText((DCanvas *)screen,SmallFont,color,local_30,y,_x,0x40001394,1,0x400013aa,uVar1,0)
  ;
  return;
}

Assistant:

void FOptionMenuItem::drawLabel(int indent, int y, EColorRange color, bool grayed)
{
	const char *label = mLabel.GetChars();
	if (*label == '$') label = GStrings(label+1);

	int overlay = grayed? MAKEARGB(96,48,0,0) : 0;

	int x;
	int w = SmallFont->StringWidth(label) * CleanXfac_1;
	if (!mCentered) x = indent - w;
	else x = (screen->GetWidth() - w) / 2;
	screen->DrawText (SmallFont, color, x, y, label, DTA_CleanNoMove_1, true, DTA_ColorOverlay, overlay, TAG_DONE);
}